

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteName(WatWriter *this,string_view str,NextChar next_char)

{
  byte *pbVar1;
  undefined1 *src;
  size_t size;
  byte *pbVar2;
  ulong size_00;
  byte *pbVar3;
  ulong uVar4;
  byte *src_00;
  long lVar5;
  string valid_str;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  size_00 = str.size_;
  src_00 = (byte *)str.data_;
  if ((size_00 == 0) || (*src_00 != 0x24)) {
    __assert_fail("!str.empty() && str.front() == \'$\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wat-writer.cc"
                  ,0x133,
                  "void wabt::(anonymous namespace)::WatWriter::WriteName(string_view, NextChar)");
  }
  pbVar1 = src_00 + size_00;
  pbVar2 = src_00;
  if (0 < (long)size_00 >> 2) {
    pbVar2 = src_00 + (size_00 & 0xfffffffffffffffc);
    lVar5 = ((long)size_00 >> 2) + 1;
    pbVar3 = src_00 + 3;
    do {
      if ((anonymous_namespace)::s_valid_name_chars[pbVar3[-3]] == '\0') {
        pbVar3 = pbVar3 + -3;
        goto LAB_0016ad7e;
      }
      if ((anonymous_namespace)::s_valid_name_chars[pbVar3[-2]] == '\0') {
        pbVar3 = pbVar3 + -2;
        goto LAB_0016ad7e;
      }
      if ((anonymous_namespace)::s_valid_name_chars[pbVar3[-1]] == '\0') {
        pbVar3 = pbVar3 + -1;
        goto LAB_0016ad7e;
      }
      if ((anonymous_namespace)::s_valid_name_chars[*pbVar3] == '\0') goto LAB_0016ad7e;
      lVar5 = lVar5 + -1;
      pbVar3 = pbVar3 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)pbVar1 - (long)pbVar2;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pbVar3 = pbVar1;
      if ((lVar5 != 3) ||
         (pbVar3 = pbVar2, (anonymous_namespace)::s_valid_name_chars[*pbVar2] == '\0'))
      goto LAB_0016ad7e;
      pbVar2 = pbVar2 + 1;
    }
    pbVar3 = pbVar2;
    if ((anonymous_namespace)::s_valid_name_chars[*pbVar2] == '\0') goto LAB_0016ad7e;
    pbVar2 = pbVar2 + 1;
  }
  pbVar3 = pbVar2;
  if ((anonymous_namespace)::s_valid_name_chars[*pbVar2] != '\0') {
    pbVar3 = pbVar1;
  }
LAB_0016ad7e:
  if (pbVar3 == pbVar1) {
    WriteNextChar(this);
    Stream::WriteData(this->stream_,src_00,size_00,(char *)0x0,No);
  }
  else {
    local_48 = 0;
    local_40[0] = 0;
    uVar4 = 0;
    local_50 = local_40;
    do {
      std::__cxx11::string::push_back((char)&local_50);
      size = local_48;
      src = local_50;
      uVar4 = uVar4 + 1;
    } while (size_00 != uVar4);
    WriteNextChar(this);
    Stream::WriteData(this->stream_,src,size,(char *)0x0,No);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  this->next_char_ = next_char;
  return;
}

Assistant:

void WatWriter::WriteString(const std::string& str, NextChar next_char) {
  WritePuts(str.c_str(), next_char);
}